

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  undefined8 uVar2;
  bool verbose;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint32_t iterations;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  long local_38;
  
  uVar9 = 100000;
  local_38 = 1;
  uVar5 = 0;
  verbose = false;
  while( true ) {
    while( true ) {
      iVar4 = getopt(argc,argv,"vhm:n:i:");
      auVar11 = in_ZMM0._0_16_;
      if (iVar4 != 0x6e) break;
      uVar9 = atoll(_optarg);
    }
    if (iVar4 < 0x69) break;
    if (iVar4 == 0x69) {
      iVar4 = atoi(_optarg);
      uVar5 = (ulong)iVar4;
    }
    else if (iVar4 == 0x6d) {
      local_38 = atoll(_optarg);
    }
    else {
      if (iVar4 != 0x76) goto LAB_00112846;
      verbose = true;
    }
  }
  if (iVar4 == -1) {
    if (uVar9 >> 0x20 != 0) {
      printf("setting n to %u \n",0xffffffff);
      uVar9 = 0xffffffff;
    }
    if (uVar5 >> 0x20 != 0) {
      printf("setting iterations to %u \n",0xffffffff);
      uVar5 = 0xffffffff;
    }
    uVar7 = uVar9 * local_38;
    uVar10 = 10;
    if (uVar7 < 1000000) {
      uVar10 = 100;
    }
    if (uVar5 != 0) {
      uVar10 = uVar5;
    }
    printf("n = %zu m = %zu \n",uVar9);
    printf("iterations = %zu \n",uVar10);
    if (uVar9 != 0) {
      uVar5 = uVar7 * 2;
      if (uVar5 < 0x400) {
        printf("array size: %zu B\n");
      }
      else {
        auVar11 = vcvtusi2sd_avx512f(auVar11,uVar5);
        if (uVar5 < 0x100000) {
          dVar1 = 0.0009765625;
          pcVar6 = "array size: %.3f kB\n";
        }
        else {
          dVar1 = 9.5367431640625e-07;
          pcVar6 = "array size: %.3f MB\n";
        }
        printf(pcVar6,auVar11._0_8_ * dVar1);
      }
      iterations = (uint32_t)uVar10;
      measurepopcnt((uint32_t)uVar7,iterations,verbose);
      measureoverhead((uint32_t)uVar7,iterations,verbose);
      lVar8 = 0;
      do {
        uVar2 = *(undefined8 *)((long)pospopcnt_u16_method_names + lVar8);
        printf("%-40s\t",uVar2);
        fflush((FILE *)0x0);
        bVar3 = benchmarkMany((uint32_t)uVar9,(uint32_t)local_38,iterations,
                              *(pospopcnt_u16_method_type *)((long)pospopcnt_u16_methods + lVar8),
                              verbose,true);
        if (!bVar3) {
          printf("Problem detected with %s.\n",uVar2);
        }
        if (verbose) {
          putchar(10);
        }
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x130);
      iVar4 = 0;
      if (verbose == false) {
        pcVar6 = "Try -v to get more details.";
        iVar4 = 0;
LAB_00112830:
        puts(pcVar6);
      }
      return iVar4;
    }
    iVar4 = 1;
    pcVar6 = "n cannot be zero.";
    goto LAB_00112830;
  }
  if (iVar4 == 0x68) {
    printf(" Try %s -n 100000 -i 15 -v \n",*argv);
    puts("-n is the number of 16-bit words ");
    puts("-i is the number of tests or iterations ");
    pcVar6 = "-v makes things verbose";
    iVar4 = 0;
    goto LAB_00112830;
  }
LAB_00112846:
  abort();
}

Assistant:

int main(int argc, char **argv) {
    size_t n = 100000;
    size_t m = 1;
    size_t iterations = 0; 
    bool verbose = false;
    int c;

    while ((c = getopt(argc, argv, "vhm:n:i:")) != -1) {
        switch (c) {
        case 'n':
            n = atoll(optarg);
            break;
        case 'm':
            m = atoll(optarg);
            break;
        case 'v':
            verbose = true;
            break;
        case 'h':
            print_usage(argv[0]);
            return EXIT_SUCCESS;
        case 'i':
            iterations = atoi(optarg);
            break;
        default:
            abort();
        }
    }

    if(n > UINT32_MAX) {
       printf("setting n to %u \n", UINT32_MAX);
       n = UINT32_MAX;
    }

    if(iterations > UINT32_MAX) {
       printf("setting iterations to %u \n", UINT32_MAX);
       iterations = UINT32_MAX;
    }

    if(iterations == 0) {
      if(m*n < 1000000) iterations = 100;
      else iterations = 10;
    }
    printf("n = %zu m = %zu \n", n, m);
    printf("iterations = %zu \n", iterations);
    if(n == 0) {
       printf("n cannot be zero.\n");
       return EXIT_FAILURE;
    }

    size_t array_in_bytes = sizeof(uint16_t) * n * m;
    if(array_in_bytes < 1024) {
      printf("array size: %zu B\n", array_in_bytes);
    } else if (array_in_bytes < 1024 * 1024) {
      printf("array size: %.3f kB\n", array_in_bytes / 1024.);
    } else {
      printf("array size: %.3f MB\n", array_in_bytes / (1024 * 1024.));
    }

#if POSPOPCNT_SIMD_VERSION >= 5
    measurepopcnt(n*m, iterations, verbose);
#endif
    measureoverhead(n*m, iterations, verbose);
   
    for (size_t k = 0; k < PPOPCNT_NUMBER_METHODS; k++) {
        printf("%-40s\t", pospopcnt_u16_method_names[k]);
        fflush(NULL);
        bool isok = benchmarkMany(n, m, iterations, pospopcnt_u16_methods[k], verbose, true);
        if (isok == false) {
            printf("Problem detected with %s.\n", pospopcnt_u16_method_names[k]);
        }
        if (verbose)
            printf("\n");
    }

    if (!verbose)
        printf("Try -v to get more details.\n");

    return EXIT_SUCCESS;
}